

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O1

QAbstractEventDispatcher * QAbstractEventDispatcher::instance(QThread *thread)

{
  QThreadData *pQVar1;
  
  if (thread == (QThread *)0x0) {
    pQVar1 = QThreadData::currentThreadData();
    if (pQVar1 == (QThreadData *)0x0) {
      pQVar1 = QThreadData::createCurrentThreadData();
    }
  }
  else {
    pQVar1 = (QThreadData *)(thread->super_QObject).d_ptr.d[2].q_ptr;
  }
  return (pQVar1->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value._M_b
         ._M_p;
}

Assistant:

QAbstractEventDispatcher *QAbstractEventDispatcher::instance(QThread *thread)
{
    QThreadData *data = thread ? QThreadData::get2(thread) : QThreadData::current();
    return data->eventDispatcher.loadRelaxed();
}